

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O0

vector<double,_std::allocator<double>_> *
tinyusdz::lerp<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *a,vector<double,_std::allocator<double>_> *b,
          double t)

{
  unsigned_long *puVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference a_00;
  const_reference b_00;
  reference pvVar4;
  double dVar5;
  ulong local_58;
  size_t i;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  size_t n;
  double local_28;
  double t_local;
  vector<double,_std::allocator<double>_> *b_local;
  vector<double,_std::allocator<double>_> *a_local;
  vector<double,_std::allocator<double>_> *dst;
  
  n._7_1_ = 0;
  local_28 = t;
  t_local = (double)b;
  b_local = a;
  a_local = __return_storage_ptr__;
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  local_40 = ::std::vector<double,_std::allocator<double>_>::size(b_local);
  local_48 = ::std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)t_local);
  puVar1 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar1;
  if (local_38 != 0) {
    ::std::vector<double,_std::allocator<double>_>::resize(__return_storage_ptr__,local_38);
    sVar2 = ::std::vector<double,_std::allocator<double>_>::size(b_local);
    sVar3 = ::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)t_local);
    if (sVar2 == sVar3) {
      for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
        a_00 = ::std::vector<double,_std::allocator<double>_>::operator[](b_local,local_58);
        b_00 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)t_local,local_58);
        dVar5 = lerp<double>(a_00,b_00,local_28);
        pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (__return_storage_ptr__,local_58);
        *pvVar4 = dVar5;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}